

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall libserver::server::_process_request_(server *this)

{
  char *__dest;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  long lVar3;
  string m;
  string msg;
  string local_a8;
  long *local_88 [2];
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  __dest = this->_incomming_message;
  local_88[0] = (long *)CONCAT71(local_88[0]._1_7_,10);
  pcVar2 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     (__dest,this->_incomming_message + this->_num_bytes_read);
  if (pcVar2 != (char *)0x0) {
    local_a8._M_dataplus._M_p._0_1_ = 10;
    pcVar2 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (__dest,__dest + this->_num_bytes_read);
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,__dest,pcVar2);
    lVar3 = (long)this->_num_bytes_read;
    if (lVar3 != 0x400) {
      memmove(__dest,this->_incomming_message + lVar3,0x400 - lVar3);
    }
    local_a8._M_dataplus._M_p._0_1_ = 10;
    pcVar2 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (__dest,this->_incomming_message + lVar3);
    this->_num_bytes_read = this->_num_bytes_read + ((int)__dest - (int)pcVar2);
    paVar1 = &local_a8.field_2;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"lo","");
    lVar3 = std::__cxx11::string::find((char *)local_88,(ulong)local_a8._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
    if (lVar3 == 0) {
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"lo","");
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)local_88);
      std::__cxx11::string::operator=((string *)&this->client_name,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      _handle_login_req(this);
      _update_client_changed();
    }
    else {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ping","");
      lVar3 = std::__cxx11::string::find((char *)local_88,(ulong)local_a8._M_dataplus._M_p,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      if (lVar3 == 0) {
        _handle_ping_req(this);
      }
      else {
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"list","");
        lVar3 = std::__cxx11::string::find((char *)local_88,(ulong)local_a8._M_dataplus._M_p,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
        if (lVar3 == 0) {
          _handle_list_request(this);
        }
        else {
          local_a8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"echo","");
          lVar3 = std::__cxx11::string::find((char *)local_88,(ulong)local_a8._M_dataplus._M_p,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
          if (lVar3 == 0) {
            local_a8._M_string_length = 0;
            local_a8.field_2._M_local_buf[0] = '\0';
            local_a8._M_dataplus._M_p = (pointer)paVar1;
            local_48[0] = local_38;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"echo","");
            std::__cxx11::string::substr((ulong)local_68,(ulong)local_88);
            std::__cxx11::string::operator=((string *)&local_a8,(string *)local_68);
            if (local_68[0] != local_58) {
              operator_delete(local_68[0],local_58[0] + 1);
            }
            if (local_48[0] != local_38) {
              operator_delete(local_48[0],local_38[0] + 1);
            }
            _display_message(this,&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_a8._M_dataplus._M_p,
                              CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                       local_a8.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
  }
  return;
}

Assistant:

void libserver::server::_process_request_()
{
    /*
        Check if complete message is read till newline character
        Handle the corresponding request
    */
    if(std::find(_incomming_message,_incomming_message+_num_bytes_read,'\n'))
    {

        // Store the message in a std::string container
        std::string msg(_incomming_message,(std::find(_incomming_message,_incomming_message+_num_bytes_read,'\n')-_incomming_message));

        // Copy the read message into buffer (_incomming_message)
        std::copy(_incomming_message+_num_bytes_read,_incomming_message+_MAX_BUF_SIZE_,_incomming_message);

        _num_bytes_read -= (std::find(_incomming_message,_incomming_message+_num_bytes_read,'\n')-_incomming_message);
        if(msg.find(_LOGIN_REQUEST_)==0)
        {   
            client_name = msg.substr((_LOGIN_REQUEST_).length());
            _handle_login_req();
            libserver::_update_client_changed();
        }
        else if(msg.find(_PING_REQUEST_)==0)
        {
            _handle_ping_req();
        }
        else if(msg.find(_REQ_CLIENT_LIST_) == 0)
        {
            _handle_list_request();
        }
        else if(msg.find(_REQ_ECHO_)==0)
        {
            std::string m;
            m = msg.substr((_REQ_ECHO_).length());
            _display_message(m);
        }
    }
}